

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Viper.cpp
# Opt level: O0

void __thiscall
chrono::viper::ViperWheel::ViperWheel
          (ViperWheel *this,string *name,ChFrame<double> *rel_pos,
          shared_ptr<chrono::ChMaterialSurface> *mat,ViperWheelType wheel_type)

{
  ChColor local_58 [2];
  shared_ptr<chrono::ChMaterialSurface> local_40;
  ViperWheelType local_2c;
  shared_ptr<chrono::ChMaterialSurface> *psStack_28;
  ViperWheelType wheel_type_local;
  shared_ptr<chrono::ChMaterialSurface> *mat_local;
  ChFrame<double> *rel_pos_local;
  string *name_local;
  ViperWheel *this_local;
  
  local_2c = wheel_type;
  psStack_28 = mat;
  mat_local = (shared_ptr<chrono::ChMaterialSurface> *)rel_pos;
  rel_pos_local = (ChFrame<double> *)name;
  name_local = (string *)this;
  std::shared_ptr<chrono::ChMaterialSurface>::shared_ptr(&local_40,mat);
  ViperPart::ViperPart(&this->super_ViperPart,name,rel_pos,&local_40,true);
  std::shared_ptr<chrono::ChMaterialSurface>::~shared_ptr(&local_40);
  (this->super_ViperPart)._vptr_ViperPart = (_func_int **)&PTR__ViperWheel_002eeef0;
  if (local_2c == RealWheel) {
    std::__cxx11::string::operator=((string *)&(this->super_ViperPart).m_mesh_name,"viper_wheel");
  }
  else if (local_2c == SimpleWheel) {
    std::__cxx11::string::operator=
              ((string *)&(this->super_ViperPart).m_mesh_name,"viper_simplewheel");
  }
  else if (local_2c == CylWheel) {
    std::__cxx11::string::operator=((string *)&(this->super_ViperPart).m_mesh_name,"viper_cylwheel")
    ;
  }
  ChColor::ChColor(local_58,0.4,0.7,0.4);
  ChColor::operator=(&(this->super_ViperPart).m_color,local_58);
  ViperPart::CalcMassProperties(&this->super_ViperPart,800.0);
  return;
}

Assistant:

ViperWheel::ViperWheel(const std::string& name,
                       const ChFrame<>& rel_pos,
                       std::shared_ptr<ChMaterialSurface> mat,
                       ViperWheelType wheel_type)
    : ViperPart(name, rel_pos, mat, true) {
    switch (wheel_type) {
        case ViperWheelType::RealWheel:
            m_mesh_name = "viper_wheel";
            break;
        case ViperWheelType::SimpleWheel:
            m_mesh_name = "viper_simplewheel";
            break;
        case ViperWheelType::CylWheel:
            m_mesh_name = "viper_cylwheel";
            break;
    }

    m_color = ChColor(0.4f, 0.7f, 0.4f);
    CalcMassProperties(800);
}